

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

QStringList * __thiscall QAccessibleComboBox::actionNames(QAccessibleComboBox *this)

{
  long lVar1;
  QList<QString> *this_00;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QList<QString> *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QList<QString>::QList((QList<QString> *)0x7d54ac);
  QAccessibleActionInterface::showMenuAction();
  this_00 = QList<QString>::operator<<(in_stack_ffffffffffffffb0,(parameter_type)in_RDI);
  QAccessibleActionInterface::pressAction();
  QList<QString>::operator<<(this_00,(parameter_type)in_RDI);
  QList<QString>::QList(this_00,in_RDI);
  QList<QString>::~QList((QList<QString> *)0x7d54ec);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QAccessibleComboBox::actionNames() const
{
    return QStringList() << showMenuAction() << pressAction();
}